

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O2

void __thiscall
Ptex::v2_2::PtexReader::getData(PtexReader *this,int faceid,void *buffer,int stride,Res res)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  byte bVar7;
  undefined4 in_register_00000034;
  int iVar8;
  undefined6 in_register_00000082;
  int iVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  void *dst;
  void *local_70;
  PtexPtr<Ptex::v2_2::PtexFaceData> d;
  PtexPtr<Ptex::v2_2::PtexFaceData> t;
  PtexFaceData *pPVar6;
  
  bVar7 = res.vlog2;
  bVar1 = res.ulog2;
  if (((-1 < faceid) && (this->_ok != false)) && ((uint)faceid < (this->_header).nfaces)) {
    uVar10 = this->_pixelsize << (bVar1 & 0x1f);
    if (stride == 0) {
      stride = uVar10;
    }
    iVar3 = (*(this->super_PtexTexture)._vptr_PtexTexture[0x14])
                      (this,CONCAT44(in_register_00000034,faceid),
                       CONCAT62(in_register_00000082,res) & 0xffffffff);
    pPVar6 = (PtexFaceData *)CONCAT44(extraout_var,iVar3);
    d._ptr = pPVar6;
    iVar3 = (*pPVar6->_vptr_PtexFaceData[3])(pPVar6);
    if ((char)iVar3 == '\0') {
      iVar3 = (*pPVar6->_vptr_PtexFaceData[7])(pPVar6);
      if ((char)iVar3 == '\0') {
        iVar3 = (*(d._ptr)->_vptr_PtexFaceData[6])();
        PtexUtils::copy((EVP_PKEY_CTX *)CONCAT44(extraout_var_04,iVar3),
                        (EVP_PKEY_CTX *)(ulong)uVar10);
      }
      else {
        uVar10 = (*(d._ptr)->_vptr_PtexFaceData[8])();
        bVar1 = bVar1 - (char)(uVar10 & 0xffff) & 0x1f;
        bVar2 = (byte)((uVar10 & 0xffff) >> 8);
        bVar7 = bVar7 - bVar2 & 0x1f;
        uVar11 = this->_pixelsize << ((byte)uVar10 & 0x1f);
        iVar12 = 0;
        iVar3 = 1 << bVar1;
        if (1 << bVar1 < 1) {
          iVar3 = iVar12;
        }
        iVar8 = 1 << bVar7;
        if (1 << bVar7 < 1) {
          iVar8 = iVar12;
        }
        local_70 = buffer;
        for (iVar5 = 0; iVar5 != iVar8; iVar5 = iVar5 + 1) {
          dst = local_70;
          for (iVar9 = 0; iVar3 != iVar9; iVar9 = iVar9 + 1) {
            iVar4 = (*(d._ptr)->_vptr_PtexFaceData[9])(d._ptr,(ulong)(uint)(iVar12 + iVar9));
            t._ptr = (PtexFaceData *)CONCAT44(extraout_var_01,iVar4);
            iVar4 = (*(t._ptr)->_vptr_PtexFaceData[3])(t._ptr);
            if ((char)iVar4 == '\0') {
              iVar4 = (*(t._ptr)->_vptr_PtexFaceData[6])();
              PtexUtils::copy((EVP_PKEY_CTX *)CONCAT44(extraout_var_03,iVar4),
                              (EVP_PKEY_CTX *)(ulong)uVar11);
            }
            else {
              iVar4 = (*(t._ptr)->_vptr_PtexFaceData[6])();
              PtexUtils::fill((void *)CONCAT44(extraout_var_02,iVar4),dst,stride,
                              1 << ((byte)uVar10 & 0x1f),1 << (bVar2 & 0x1f),this->_pixelsize);
            }
            dst = (void *)((long)dst + (long)(int)uVar11);
            PtexPtr<Ptex::v2_2::PtexFaceData>::~PtexPtr(&t);
          }
          local_70 = (void *)((long)local_70 + (long)(stride << (bVar2 & 0x1f)));
          iVar12 = iVar12 + iVar3;
        }
      }
    }
    else {
      iVar3 = (*pPVar6->_vptr_PtexFaceData[6])(pPVar6);
      PtexUtils::fill((void *)CONCAT44(extraout_var_00,iVar3),buffer,stride,1 << (bVar1 & 0x1f),
                      1 << (bVar7 & 0x1f),this->_pixelsize);
    }
    PtexPtr<Ptex::v2_2::PtexFaceData>::~PtexPtr(&d);
    return;
  }
  PtexUtils::fill((this->_errorPixel).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start,buffer,stride,1 << (bVar1 & 0x1f),
                  1 << (bVar7 & 0x1f),this->_pixelsize);
  return;
}

Assistant:

void PtexReader::getData(int faceid, void* buffer, int stride, Res res)
{
    if (!_ok || faceid < 0 || size_t(faceid) >= _header.nfaces) {
        PtexUtils::fill(&_errorPixel[0], buffer, stride, res.u(), res.v(), _pixelsize);
        return;
    }

    // note - all locking is handled in called getData methods
    int resu = res.u(), resv = res.v();
    int rowlen = _pixelsize * resu;
    if (stride == 0) stride = rowlen;

    PtexPtr<PtexFaceData> d ( getData(faceid, res) );
    if (d->isConstant()) {
        // fill dest buffer with pixel value
        PtexUtils::fill(d->getData(), buffer, stride,
                        resu, resv, _pixelsize);
    }
    else if (d->isTiled()) {
        // loop over tiles
        Res tileres = d->tileRes();
        int ntilesu = res.ntilesu(tileres);
        int ntilesv = res.ntilesv(tileres);
        int tileures = tileres.u();
        int tilevres = tileres.v();
        int tilerowlen = _pixelsize * tileures;
        int tile = 0;
        char* dsttilerow = (char*) buffer;
        for (int i = 0; i < ntilesv; i++) {
            char* dsttile = dsttilerow;
            for (int j = 0; j < ntilesu; j++) {
                PtexPtr<PtexFaceData> t ( d->getTile(tile++) );
                if (t->isConstant())
                    PtexUtils::fill(t->getData(), dsttile, stride,
                                    tileures, tilevres, _pixelsize);
                else
                    PtexUtils::copy(t->getData(), tilerowlen, dsttile, stride,
                                    tilevres, tilerowlen);
                dsttile += tilerowlen;
            }
            dsttilerow += stride * tilevres;
        }
    }
    else {
        PtexUtils::copy(d->getData(), rowlen, buffer, stride, resv, rowlen);
    }
}